

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlSelect.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControlSelect::ElementFormControlSelect(ElementFormControlSelect *this,String *tag)

{
  WidgetDropDown *this_00;
  
  ElementFormControl::ElementFormControl(&this->super_ElementFormControl,tag);
  (this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
  _vptr_Releasable = (_func_int **)&PTR__ElementFormControlSelect_00399f30;
  this->widget = (WidgetDropDown *)0x0;
  this_00 = (WidgetDropDown *)operator_new(0x58);
  WidgetDropDown::WidgetDropDown(this_00,&this->super_ElementFormControl);
  this->widget = this_00;
  return;
}

Assistant:

ElementFormControlSelect::ElementFormControlSelect(const String& tag) : ElementFormControl(tag), widget(nullptr)
{
	widget = new WidgetDropDown(this);
}